

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall
QGraphicsEllipseItem::QGraphicsEllipseItem
          (QGraphicsEllipseItem *this,QRectF *rect,QGraphicsItem *parent)

{
  QAbstractGraphicsShapeItemPrivate *in_RDX;
  QAbstractGraphicsShapeItem *in_RSI;
  QGraphicsEllipseItemPrivate *in_RDI;
  
  operator_new(0x1d0);
  QGraphicsEllipseItemPrivate::QGraphicsEllipseItemPrivate(in_RDI);
  QAbstractGraphicsShapeItem::QAbstractGraphicsShapeItem(in_RSI,in_RDX,(QGraphicsItem *)in_RDI);
  (in_RDI->super_QAbstractGraphicsShapeItemPrivate).super_QGraphicsItemPrivate.
  _vptr_QGraphicsItemPrivate = (_func_int **)&PTR__QGraphicsEllipseItem_00d329d8;
  setRect((QGraphicsEllipseItem *)in_RDX,(QRectF *)in_RDI);
  return;
}

Assistant:

QGraphicsEllipseItem::QGraphicsEllipseItem(const QRectF &rect, QGraphicsItem *parent)
    : QAbstractGraphicsShapeItem(*new QGraphicsEllipseItemPrivate, parent)
{
    setRect(rect);
}